

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O3

tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Nussinov::nussinov_abi_cxx11_
          (tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Nussinov *this,ostream *fout)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  pointer pdVar7;
  pointer ptVar8;
  pointer piVar9;
  char cVar10;
  int a;
  int iVar11;
  int i;
  int iVar12;
  int iVar13;
  int a_00;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar18;
  int iVar19;
  int iVar20;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  long lVar21;
  long lVar22;
  char *pcVar23;
  ulong uVar24;
  ostream *poVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int (*paaiVar30) [6] [3];
  int (*paiVar31) [3];
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int (*paiVar36) [3];
  int iVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  int i_00;
  int iVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  int iVar46;
  int iVar47;
  void *pvVar48;
  int iVar49;
  ulong uVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  ulong uVar55;
  int iVar56;
  int iVar57;
  ulong uVar58;
  int iVar59;
  int iVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  int iVar66;
  bool bVar67;
  int iVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double local_2a8;
  int local_258;
  int local_254;
  ulong local_250;
  long local_238;
  int local_22c;
  int local_228;
  int local_224;
  int (*local_220) [3];
  ulong local_200;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1ac;
  ulong local_1a8;
  int (*local_1a0) [3];
  ulong local_188;
  long local_f8;
  string rna;
  string bp;
  
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"Nussinov",8);
  cVar10 = (char)fout;
  std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar10);
  std::ostream::put(cVar10);
  std::ostream::flush();
  pvVar48 = (void *)(ulong)(uint)this->n;
  if (this->n < 1) {
    local_2a8 = 0.0;
  }
  else {
    iVar33 = 0x48;
    uVar44 = 0;
    do {
      uVar39 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar44]];
      iVar29 = (int)uVar44;
      local_200 = 3;
      paaiVar30 = nucleotides;
      local_238 = 0;
      iVar32 = iVar33;
      do {
        local_220 = nucleotides[0];
        uVar40 = 0;
        local_1a0 = *paaiVar30;
        iVar38 = iVar32;
        do {
          lVar22 = uVar40 + local_238;
          iVar16 = sigma(iVar29,(int)lVar22);
          iVar52 = (int)uVar40;
          iVar17 = sigma(iVar29,iVar52);
          if ((this->g < iVar16 - iVar17) && (0 < (int)uVar39)) {
            iVar17 = (int)local_238 + iVar52;
            uVar61 = 0;
            paiVar31 = local_220;
            paiVar36 = local_1a0;
            iVar16 = iVar38;
            do {
              lVar21 = (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar44];
              bVar14 = complementary(paiVar31[lVar21 * 6][0],paiVar36[lVar21 * 6][0]);
              dVar70 = 0.0;
              if ((((long)uVar40 < lVar22 + -1 && (lVar22 != 0 && uVar40 < 2)) && bVar14) &&
                 (dVar70 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[iVar16] + 1.0, dVar70 <= 0.0)) {
                dVar70 = 0.0;
              }
              if (local_238 != 0) {
                pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                dVar72 = pdVar7[iVar16 + 0x24];
                if (dVar72 <= dVar70) {
                  dVar72 = dVar70;
                }
                dVar70 = pdVar7[iVar16 + 0x6c];
                if (dVar70 <= dVar72) {
                  dVar70 = dVar72;
                }
              }
              m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
              ptVar8 = (this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + extraout_EAX;
              iVar54 = (int)uVar61;
              if (*(double *)
                   &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= dVar70 &&
                  dVar70 != *(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
                ptVar8 = (this->codon_index).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar8[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar54;
                ptVar8[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar54;
                ptVar8[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)dVar70;
              }
              m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
              ptVar8 = (this->codon_index_x).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_01;
              if (*(double *)
                   &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= dVar70 &&
                  dVar70 != *(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
                ptVar8 = (this->codon_index_x).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar8[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar54;
                ptVar8[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar54;
                ptVar8[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)dVar70;
              }
              m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
              ptVar8 = (this->codon_index_y).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_03;
              if (*(double *)
                   &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= dVar70 &&
                  dVar70 != *(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar29,(char *)(uVar44 & 0xffffffff),iVar52,iVar17);
                ptVar8 = (this->codon_index_y).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar8[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar54;
                ptVar8[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar54;
                ptVar8[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)dVar70;
              }
              (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [iVar54 * 7 + (iVar29 * 9 + 6 + iVar52 * -3 + (int)lVar22) * 0x24] = dVar70;
              uVar61 = uVar61 + 1;
              paiVar36 = paiVar36 + 1;
              paiVar31 = paiVar31 + 1;
              iVar16 = iVar16 + 7;
            } while (uVar39 != uVar61);
          }
          uVar40 = uVar40 + 1;
          local_1a0 = (int (*) [3])(*local_1a0 + 1);
          local_220 = (int (*) [3])(*local_220 + 1);
          iVar38 = iVar38 + -0x48;
        } while (uVar40 != local_200);
        local_238 = local_238 + 1;
        local_200 = local_200 - 1;
        paaiVar30 = (int (*) [6] [3])((*paaiVar30)[0] + 1);
        iVar32 = iVar32 + 0x24;
      } while (local_238 != 3);
      uVar44 = uVar44 + 1;
      pvVar48 = (void *)(long)this->n;
      iVar33 = iVar33 + 0x144;
    } while ((long)uVar44 < (long)pvVar48);
    local_2a8 = 0.0;
    if (1 < this->n) {
      uVar44 = 1;
      iVar29 = 0x1f8;
      iVar33 = 0;
      local_22c = -0x24;
      iVar32 = 0x21c;
      iVar16 = 0x48;
      local_224 = 0x24;
      iVar17 = 0x1b0;
      iVar52 = 0x288;
      iVar54 = 0x1b0;
      iVar38 = -0x24;
      local_1a8 = 0;
      local_2a8 = 0.0;
      do {
        lVar22 = (long)(int)pvVar48;
        if ((long)uVar44 < lVar22) {
          local_188 = 1;
          iVar57 = 0x18c;
          iVar41 = 9;
          iVar60 = 0x48;
          local_250 = local_1a8;
          uVar40 = 0;
          iVar51 = iVar52;
          iVar56 = iVar38;
          iVar49 = iVar16;
          iVar53 = iVar32;
          local_1ec = iVar29;
          local_1e8 = iVar54;
          local_1e4 = iVar17;
          do {
            uVar1 = uVar40 + uVar44;
            a = (int)uVar40;
            iVar11 = (int)uVar44;
            pcVar23 = (char *)(ulong)(uint)(a + iVar11);
            piVar9 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar39 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar9[uVar40]];
            uVar5 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar9[uVar1]];
            uVar61 = uVar40 + 1;
            iVar26 = (a + iVar11) * 2;
            iVar34 = iVar26 - (int)uVar61;
            uVar24 = (uVar44 + uVar40) - 1;
            iVar26 = iVar26 - a;
            a_00 = (int)uVar1;
            local_f8 = 0;
            uVar50 = 2;
            local_1e0 = iVar56;
            local_1dc = iVar49;
            local_1d8 = iVar57;
            local_1d4 = iVar60;
            local_1d0 = iVar51;
            local_1b8 = iVar41;
            iVar35 = iVar53;
            do {
              i = (int)uVar50;
              local_1c0 = local_1e4;
              local_1c4 = local_1e8;
              local_1cc = local_1ec;
              lVar22 = 0;
              local_1c8 = iVar53;
              iVar68 = iVar35;
              do {
                i_00 = (int)lVar22;
                iVar18 = sigma(a_00,i_00);
                iVar19 = sigma(a,i);
                dVar70 = local_2a8;
                if ((this->g < iVar18 - iVar19) && (0 < (int)uVar39)) {
                  bVar14 = lVar22 == 0;
                  iVar18 = (a_00 * 9 + 6 + i_00) * 0x24;
                  iVar37 = 0;
                  local_1b4 = local_1d4;
                  local_228 = local_1dc;
                  local_1bc = local_1e0;
                  uVar65 = 0;
                  iVar43 = local_1d0;
                  iVar47 = iVar68;
                  iVar19 = local_1d8;
                  do {
                    if (0 < (int)uVar5) {
                      iVar12 = (int)uVar65;
                      iVar13 = iVar12 * 7;
                      iVar20 = iVar13 + (a * 9 + 8 + i * -3) * 0x24;
                      iVar27 = iVar12 * 6;
                      local_258 = local_1c4;
                      local_1ac = local_1cc;
                      uVar62 = 0;
                      local_254 = iVar47;
                      iVar4 = local_1c0;
                      iVar3 = iVar43;
                      iVar2 = local_1c8;
                      do {
                        piVar9 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        bVar15 = complementary(nucleotides[piVar9[uVar40]][uVar65][uVar50],
                                               nucleotides[piVar9[uVar1]][uVar62][lVar22]);
                        dVar72 = 0.0;
                        iVar59 = (int)uVar62;
                        if (bVar15) {
                          if (1 < uVar50 || bVar14) {
                            dVar71 = dVar72;
                            if (!bVar14 && uVar50 == 2) {
                              if (1 < uVar44) {
                                lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [(this->protein).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar61]];
                                dVar72 = 1.0;
                                if (0 < lVar21) {
                                  iVar28 = (this->n * 9 + -9) * iVar33 + local_1ac;
                                  dVar71 = 0.0;
                                  do {
                                    dVar72 = (this->value).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar28];
                                    if (dVar72 <= dVar71) {
                                      dVar72 = dVar71;
                                    }
                                    iVar28 = iVar28 + 6;
                                    lVar21 = lVar21 + -1;
                                    dVar71 = dVar72;
                                  } while (lVar21 != 0);
                                  dVar72 = dVar72 + 1.0;
                                }
                                if (dVar72 <= 0.0) {
                                  dVar72 = 0.0;
                                }
                              }
                              dVar71 = dVar72;
                              if ((uVar44 == 1) &&
                                 (dVar71 = (this->value).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [iVar59 * 7 +
                                            ((this->n * 9 + -9) * (int)local_1a8 +
                                            iVar34 * 9 + 5 + i_00) * 0x24] + 1.0, dVar71 <= dVar72))
                              {
                                dVar71 = dVar72;
                              }
                            }
                            if (1 < uVar50 || !bVar14) {
                              dVar72 = dVar71;
                              if (bVar14 && uVar50 == 2) {
                                if (uVar61 < uVar24) {
                                  piVar9 = (this->protein).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start;
                                  dVar72 = 1.0;
                                  if (0 < (long)n_codon.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start
                                                [piVar9[uVar61]]) {
                                    iVar28 = (this->n * 9 + -9) * local_22c + iVar56;
                                    dVar72 = 0.0;
                                    lVar21 = 0;
                                    do {
                                      uVar55 = (ulong)(uint)n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [piVar9[uVar1 - 1]];
                                      iVar42 = iVar28;
                                      if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start
                                              [piVar9[uVar1 - 1]]) {
                                        do {
                                          dVar69 = (this->value).
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar42];
                                          if (dVar69 <= dVar72) {
                                            dVar69 = dVar72;
                                          }
                                          dVar72 = dVar69;
                                          iVar42 = iVar42 + 1;
                                          uVar55 = uVar55 - 1;
                                        } while (uVar55 != 0);
                                      }
                                      lVar21 = lVar21 + 1;
                                      iVar28 = iVar28 + 6;
                                    } while (lVar21 != n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [piVar9[uVar61]]);
                                    dVar72 = dVar72 + 1.0;
                                  }
                                  if (dVar72 <= dVar71) {
                                    dVar72 = dVar71;
                                  }
                                }
                                local_2a8 = dVar72;
                                if (uVar61 == uVar24) {
                                  lVar21 = (long)n_codon.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [(this->protein).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar61]];
                                  local_2a8 = 1.0;
                                  if (0 < lVar21) {
                                    iVar28 = (this->n * 9 + -9) * local_22c + iVar56;
                                    dVar71 = 0.0;
                                    do {
                                      local_2a8 = (this->value).
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar28];
                                      if (local_2a8 <= dVar71) {
                                        local_2a8 = dVar71;
                                      }
                                      iVar28 = iVar28 + 7;
                                      lVar21 = lVar21 + -1;
                                      dVar71 = local_2a8;
                                    } while (lVar21 != 0);
                                    local_2a8 = local_2a8 + 1.0;
                                  }
                                  if (local_2a8 <= dVar72) {
                                    local_2a8 = dVar72;
                                  }
                                }
                                iVar28 = sigma(a_00,0);
                                iVar42 = sigma(a,2);
                                dVar72 = local_2a8;
                                if ((iVar28 + -1 == iVar42 + this->g) &&
                                   (dVar72 = 1.0, 1.0 <= local_2a8)) {
                                  dVar72 = local_2a8;
                                }
                              }
                            }
                            else {
                              dVar69 = dVar71;
                              if (uVar40 < uVar24) {
                                lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [(this->protein).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar1 - 1]]
                                ;
                                dVar69 = 1.0;
                                if (0 < lVar21) {
                                  iVar28 = (this->n * 9 + -9) * iVar33 + local_1bc;
                                  dVar72 = 0.0;
                                  do {
                                    dVar69 = (this->value).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar28];
                                    if (dVar69 <= dVar72) {
                                      dVar69 = dVar72;
                                    }
                                    iVar28 = iVar28 + 1;
                                    lVar21 = lVar21 + -1;
                                    dVar72 = dVar69;
                                  } while (lVar21 != 0);
                                  dVar69 = dVar69 + 1.0;
                                }
                                if (dVar69 <= dVar71) {
                                  dVar69 = dVar71;
                                }
                              }
                              dVar72 = dVar69;
                              if ((uVar40 == uVar24) &&
                                 (dVar72 = (this->value).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(iVar26 * 9 + -0xd + i * -3) * 0x24 + iVar13] + 1.0,
                                 dVar72 <= dVar69)) {
                                dVar72 = dVar69;
                              }
                            }
                            goto LAB_00110df3;
                          }
                          dVar72 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [iVar27 + iVar59 +
                                    ((this->n * 9 + -9) * iVar11 + iVar26 * 9 + 2 + i * -3 + i_00) *
                                    0x24] + 1.0;
                          if (dVar72 <= 0.0) {
                            dVar72 = 0.0;
                          }
LAB_00110e01:
                          dVar71 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [iVar27 + iVar59 +
                                    ((this->n * 9 + -9) * iVar11 + iVar26 * 9 + 3 + i * -3 + i_00) *
                                    0x24];
                          if (dVar71 <= dVar72) {
                            dVar71 = dVar72;
                          }
                        }
                        else {
LAB_00110df3:
                          dVar71 = dVar72;
                          if (uVar50 < 2) goto LAB_00110e01;
                        }
                        dVar72 = dVar71;
                        if ((lVar22 != 0) &&
                           (dVar72 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start
                                     [iVar27 + iVar59 +
                                      ((this->n * 9 + -9) * iVar11 + iVar26 * 9 + 5 + i * -3 + i_00)
                                      * 0x24], dVar72 <= dVar71)) {
                          dVar72 = dVar71;
                        }
                        dVar71 = dVar72;
                        if (uVar50 == 2) {
                          if (1 < uVar44) {
                            lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar61]];
                            if (lVar21 < 1) goto LAB_00110f19;
                            iVar28 = (this->n * 9 + -9) * iVar33 + iVar2;
                            do {
                              dVar72 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[iVar28];
                              if (dVar72 <= dVar71) {
                                dVar72 = dVar71;
                              }
                              iVar28 = iVar28 + 6;
                              lVar21 = lVar21 + -1;
                              dVar71 = dVar72;
                            } while (lVar21 != 0);
                          }
                          dVar71 = dVar72;
                          if ((uVar44 == 1) &&
                             (dVar71 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [iVar59 * 7 +
                                        ((this->n * 9 + -9) * (int)local_1a8 + iVar34 * 9 + 6 + i_00
                                        ) * 0x24], dVar71 <= dVar72)) {
                            dVar71 = dVar72;
                          }
                        }
LAB_00110f19:
                        dVar72 = dVar71;
                        if (lVar22 == 0) {
                          if ((uVar40 < uVar24) &&
                             (lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start
                                             [(this->protein).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar1 - 1]],
                             0 < lVar21)) {
                            iVar28 = (this->n * 9 + -9) * iVar33 + local_228;
                            do {
                              dVar71 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[iVar28];
                              if (dVar71 <= dVar72) {
                                dVar71 = dVar72;
                              }
                              iVar28 = iVar28 + 1;
                              lVar21 = lVar21 + -1;
                              dVar72 = dVar71;
                            } while (lVar21 != 0);
                          }
                          dVar72 = dVar71;
                          if ((uVar40 == uVar24) &&
                             (dVar72 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [(iVar26 * 9 + -10 + i * -3) * 0x24 + iVar13],
                             dVar72 <= dVar71)) {
                            dVar72 = dVar71;
                          }
                        }
                        if (uVar61 < uVar24 && (long)uVar40 < (long)(uVar44 + uVar40 + -2)) {
                          pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          piVar9 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                          iVar28 = this->n * 0x144;
                          iVar42 = iVar19 + iVar28;
                          uVar55 = local_188;
                          uVar45 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[piVar9[local_188]];
                          do {
                            lVar21 = uVar55 + 1;
                            uVar55 = uVar55 + 1;
                            uVar6 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[piVar9[lVar21]];
                            if (0 < (int)uVar6) {
                              uVar63 = 0;
                              do {
                                if (0 < (int)uVar45) {
                                  uVar58 = (ulong)uVar45;
                                  dVar71 = dVar72;
                                  iVar46 = iVar42;
                                  do {
                                    dVar72 = pdVar7[iVar46] +
                                             pdVar7[(int)(iVar59 + uVar63 * 6 +
                                                         ((a_00 * 2 - (int)uVar55) * 9 + i_00 + 6 +
                                                         (a_00 - (int)uVar55) * (this->n * 9 + -9))
                                                         * 0x24)];
                                    if (dVar72 <= dVar71) {
                                      dVar72 = dVar71;
                                    }
                                    iVar46 = iVar46 + 1;
                                    uVar58 = uVar58 - 1;
                                    dVar71 = dVar72;
                                  } while (uVar58 != 0);
                                }
                                uVar63 = uVar63 + 1;
                              } while (uVar63 != uVar6);
                            }
                            iVar42 = iVar42 + iVar28 + 0x144;
                            uVar45 = uVar6;
                          } while (uVar55 != local_250);
                        }
                        if (uVar40 < uVar24) {
                          lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start
                                         [(this->protein).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar61]];
                          if (0 < lVar21) {
                            pdVar7 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                            iVar28 = (this->n * 9 + -9) * iVar33 + iVar2;
                            dVar71 = dVar72;
                            do {
                              dVar72 = pdVar7[iVar28] + pdVar7[iVar20];
                              if (dVar72 <= dVar71) {
                                dVar72 = dVar71;
                              }
                              iVar28 = iVar28 + 6;
                              lVar21 = lVar21 + -1;
                              dVar71 = dVar72;
                            } while (lVar21 != 0);
                            if (uVar24 <= uVar40) goto LAB_001111a3;
                          }
                          lVar21 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start
                                         [(this->protein).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar1 - 1]];
                          if (0 < lVar21) {
                            pdVar7 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                            iVar28 = (this->n * 9 + -9) * iVar33 + local_228;
                            dVar71 = dVar72;
                            do {
                              dVar72 = pdVar7[iVar28] + pdVar7[iVar59 * 7 + iVar18];
                              if (dVar72 <= dVar71) {
                                dVar72 = dVar71;
                              }
                              iVar28 = iVar28 + 1;
                              lVar21 = lVar21 + -1;
                              dVar71 = dVar72;
                            } while (lVar21 != 0);
                          }
                        }
LAB_001111a3:
                        dVar71 = dVar72;
                        if ((uVar40 == uVar24) &&
                           (pdVar7 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                           dVar71 = pdVar7[iVar20] + pdVar7[iVar59 * 7 + iVar18], dVar71 <= dVar72))
                        {
                          dVar71 = dVar72;
                        }
                        if (uVar40 < uVar24 && 1 < uVar44) {
                          pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          iVar28 = this->n;
                          iVar42 = iVar28 * 9 + local_1b8;
                          iVar46 = (iVar28 * 9 + -9) * iVar33 + local_258;
                          uVar55 = local_188;
                          do {
                            iVar64 = 0;
                            bVar15 = true;
                            do {
                              bVar67 = bVar15;
                              if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start
                                      [(this->protein).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar55]]) {
                                iVar66 = iVar37 + (iVar42 + iVar64) * 0x24;
                                iVar64 = iVar46 + iVar64 * -0x6c;
                                uVar58 = (ulong)(uint)n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [(this->protein).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[uVar55]]
                                ;
                                dVar72 = dVar71;
                                do {
                                  dVar71 = pdVar7[iVar66] + pdVar7[iVar64];
                                  if (dVar71 <= dVar72) {
                                    dVar71 = dVar72;
                                  }
                                  iVar66 = iVar66 + 1;
                                  iVar64 = iVar64 + 6;
                                  uVar58 = uVar58 - 1;
                                  dVar72 = dVar71;
                                } while (uVar58 != 0);
                              }
                              iVar64 = 1;
                              bVar15 = false;
                            } while (bVar67);
                            uVar55 = uVar55 + 1;
                            iVar42 = iVar42 + iVar28 * 9 + 9;
                            iVar46 = iVar46 + iVar28 * -0x144;
                          } while (uVar55 < uVar1);
                        }
                        uVar45 = this->n;
                        if (uVar50 < 2) {
                          pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          iVar42 = (uVar45 * 9 + -9) * local_224 + local_254;
                          lVar21 = local_f8;
                          iVar28 = local_1b4;
                          do {
                            dVar72 = pdVar7[iVar28] + pdVar7[iVar42];
                            if (dVar72 <= dVar71) {
                              dVar72 = dVar71;
                            }
                            dVar71 = dVar72;
                            iVar28 = iVar28 + 0x24;
                            iVar42 = iVar42 + -0x6c;
                            lVar21 = lVar21 + -1;
                          } while (lVar21 != 0);
                        }
                        if (lVar22 != 0) {
                          pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          iVar42 = (uVar45 * 9 + -9) * local_224 + iVar3;
                          lVar21 = lVar22;
                          dVar72 = dVar71;
                          iVar28 = iVar4;
                          do {
                            dVar71 = pdVar7[iVar42] + pdVar7[iVar28];
                            if (dVar71 <= dVar72) {
                              dVar71 = dVar72;
                            }
                            iVar42 = iVar42 + 0x24;
                            iVar28 = iVar28 + -0x6c;
                            lVar21 = lVar21 + -1;
                            dVar72 = dVar71;
                          } while (lVar21 != 0);
                        }
                        m((void *)(ulong)uVar45,a,pcVar23,i,i_00);
                        ptVar8 = (this->codon_index).
                                 super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_05;
                        if (*(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                            dVar71 && dVar71 != *(double *)
                                                 &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>)
                                                  .super__Tuple_impl<1UL,_int,_double>.
                                                  super__Tuple_impl<2UL,_double>) {
                          m((void *)(ulong)(uint)this->n,a,pcVar23,i,i_00);
                          ptVar8 = (this->codon_index).
                                   super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          *(int *)&ptVar8[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                                   super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar12;
                          ptVar8[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl = iVar59;
                          ptVar8[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                               (_Tuple_impl<2UL,_double>)dVar71;
                        }
                        m((void *)(ulong)(uint)this->n,a,pcVar23,i,i_00);
                        ptVar8 = (this->codon_index_x).
                                 super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_07;
                        if (*(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                            dVar71 && dVar71 != *(double *)
                                                 &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>)
                                                  .super__Tuple_impl<1UL,_int,_double>.
                                                  super__Tuple_impl<2UL,_double>) {
                          m((void *)(ulong)(uint)this->n,a,pcVar23,i,i_00);
                          ptVar8 = (this->codon_index_x).
                                   super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          *(int *)&ptVar8[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                                   super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar12;
                          ptVar8[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl = iVar59;
                          ptVar8[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                               (_Tuple_impl<2UL,_double>)dVar71;
                        }
                        m((void *)(ulong)(uint)this->n,a,pcVar23,i,i_00);
                        ptVar8 = (this->codon_index_y).
                                 super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_09;
                        if (*(double *)
                             &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>).
                              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                            dVar71 && dVar71 != *(double *)
                                                 &(ptVar8->super__Tuple_impl<0UL,_int,_int,_double>)
                                                  .super__Tuple_impl<1UL,_int,_double>.
                                                  super__Tuple_impl<2UL,_double>) {
                          m((void *)(ulong)(uint)this->n,a,pcVar23,i,i_00);
                          ptVar8 = (this->codon_index_y).
                                   super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          *(int *)&ptVar8[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                                   super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar12;
                          ptVar8[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                          _M_head_impl = iVar59;
                          ptVar8[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                          super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                               (_Tuple_impl<2UL,_double>)dVar71;
                        }
                        (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [iVar27 + iVar59 +
                         ((this->n * 9 + -9) * iVar11 + iVar26 * 9 + 6 + i * -3 + i_00) * 0x24] =
                             dVar71;
                        if (dVar71 <= dVar70) {
                          dVar71 = dVar70;
                        }
                        dVar70 = dVar71;
                        uVar62 = uVar62 + 1;
                        local_1ac = local_1ac + 1;
                        iVar2 = iVar2 + 1;
                        local_258 = local_258 + 1;
                        local_254 = local_254 + 1;
                        iVar3 = iVar3 + 1;
                        iVar4 = iVar4 + 7;
                      } while (uVar62 != uVar5);
                    }
                    uVar65 = uVar65 + 1;
                    local_1bc = local_1bc + 6;
                    local_228 = local_228 + 6;
                    iVar19 = iVar19 + 6;
                    iVar37 = iVar37 + 6;
                    local_1b4 = local_1b4 + 7;
                    iVar47 = iVar47 + 6;
                    iVar43 = iVar43 + 6;
                  } while (uVar65 != uVar39);
                }
                lVar22 = lVar22 + 1;
                local_1cc = local_1cc + 0x24;
                local_1c8 = local_1c8 + 0x24;
                local_1c4 = local_1c4 + 0x24;
                iVar68 = iVar68 + 0x24;
                local_1c0 = local_1c0 + 0x24;
                local_2a8 = dVar70;
              } while (lVar22 != 3);
              local_1e0 = local_1e0 + 0x6c;
              local_1dc = local_1dc + 0x6c;
              local_1d8 = local_1d8 + 0x6c;
              local_1b8 = local_1b8 + 3;
              local_1d4 = local_1d4 + 0x48;
              iVar35 = iVar35 + 0x6c;
              local_f8 = local_f8 + 1;
              local_1d0 = local_1d0 + 0x6c;
              bVar14 = uVar50 != 0;
              uVar50 = uVar50 - 1;
            } while (bVar14);
            pvVar48 = (void *)(ulong)(uint)this->n;
            lVar22 = (long)this->n;
            local_188 = local_188 + 1;
            local_250 = local_250 + 1;
            local_1ec = local_1ec + 0x144;
            iVar56 = iVar56 + 0x144;
            iVar53 = iVar53 + 0x144;
            iVar49 = iVar49 + 0x144;
            iVar57 = iVar57 + 0x144;
            iVar41 = iVar41 + 9;
            local_1e8 = local_1e8 + 0x144;
            iVar60 = iVar60 + 0x144;
            iVar51 = iVar51 + 0x144;
            local_1e4 = local_1e4 + 0x144;
            uVar40 = uVar61;
          } while ((long)(uVar61 + uVar44) < lVar22);
        }
        uVar44 = uVar44 + 1;
        local_1a8 = local_1a8 + 1;
        iVar29 = iVar29 + 0x288;
        iVar33 = iVar33 + 0x24;
        iVar38 = iVar38 + 0x288;
        local_22c = local_22c + 0x24;
        iVar32 = iVar32 + 0x288;
        iVar16 = iVar16 + 0x288;
        iVar54 = iVar54 + 0x288;
        local_224 = local_224 + 0x24;
        iVar52 = iVar52 + 0x288;
        iVar17 = iVar17 + 0x144;
      } while ((long)uVar44 < lVar22);
    }
  }
  uVar39 = (int)pvVar48 - 1;
  m(pvVar48,0,(char *)(ulong)uVar39,0,2);
  iVar33 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_11].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  find_bp_abi_cxx11_(&bp,this,0,uVar39,0,2,iVar33,
                     (this->codon_index).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_12].
                     super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                     super__Head_base<1UL,_int,_false>._M_head_impl,0);
  uVar39 = this->n - 1;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar39,0,2);
  iVar33 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_13].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  find_bp_abi_cxx11_(&rna,this,0,uVar39,0,2,iVar33,
                     (this->codon_index).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_14].
                     super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                     super__Head_base<1UL,_int,_false>._M_head_impl,1);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"corresponding base pairs: ",0x1a);
  poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                      (fout,bp._M_dataplus._M_p,bp._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,",length: ",9);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"corresponding rna: ",0x13);
  poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                      (fout,rna._M_dataplus._M_p,rna._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,",size: ",7);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"max base pair: ",0xf);
  poVar25 = std::ostream::_M_insert<double>(local_2a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"Time taken by program is : ",0x1b);
  std::ostream::_M_insert<long>((long)fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"sec",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar10);
  std::ostream::put(cVar10);
  std::ostream::flush();
  uVar39 = this->n - 1;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar39,0,2);
  iVar33 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_15].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  iVar29 = (this->codon_index).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_16].
           super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
           super__Head_base<1UL,_int,_false>._M_head_impl;
  iVar32 = this->n;
  pdVar7 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
            ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
             &rna,&bp);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super__Head_base<0UL,_double,_false>._M_head_impl =
       pdVar7[(int)(iVar29 + iVar33 * 6 + (iVar32 * 9 + 9) * uVar39 * 0x24 + 0x120)];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rna._M_dataplus._M_p != &rna.field_2) {
    operator_delete(rna._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bp._M_dataplus._M_p != &bp.field_2) {
    operator_delete(bp._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<double, string, string> Nussinov::nussinov(ostream &fout) {
    auto start = chrono::high_resolution_clock::now();
    fout << "Nussinov" << endl;

    double ans = 0;
    double ret = 0;
    double local_max = 0;

    // when a == b
    for (int a = 0,b; a < n; a++) {
        b=a;
        const int n_codon_a = n_codon[protein[a]];
        for (int l = 0; l < 3; l++) {
            for (int i = 0 , j; i+l < 3; i++) {
                j = i + l;
                if (sigma(b, j) - sigma(a, i) <= g) continue;
                for (int x = 0; x < n_codon_a; x++) {
                    ret = 0;
                    if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][x][j])) {
                        // F [a][b][i + 1][j − 1][x][x] + 1
                        if (i <= 1 && j >= 1 && i < j - 1) {
                            ret = max(ret, Access(a, b,i + 1, j - 1, x, x) + 1);
                        }

                    }

                    //F [a][b][i + 1][j][x][x]
                    if (i <= 1 && i + 1 <= j) {
                        ret = max(ret, Access(a, b, i + 1, j, x, x));
                    }
                    //F [a][b][i][j − 1][x][x]
                    if (j >= 1 && i <= j - 1) {
                        ret = max(ret, Access(a, b, i, j - 1, x, x));
                    }

                    if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                        codon_index[m(n,a,b,i,j)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                        codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_y[m(n, a, b,i,j,x)])) {
                        codon_index_y[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    Access(a, b, i, j, x, x) = ret;
                }
//                cout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",index: " << (9*n*(b-a)+(3*j-2*i)) << endl;
            }
        }
    }


    for (int len = 1; len < n; len++) {
        for(int a = 0,b; a+len < n; a++){
            b=a+len;
            const int n_codon_a = n_codon[protein[a]];
            const int n_codon_b = n_codon[protein[b]];
            for (int i = 2; i >= 0; i--) {
                for (int j = 0; j < 3; j++) {
                    if (sigma(b,j) - sigma(a,i) <= g) continue;
                    for (int x = 0; x < n_codon_a; x++) {
                        for (int y = 0; y < n_codon_b; y++) {
                            ret = 0;
                            // i, j pair
                            if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][y][j])) {
                                //F [a][b][i + 1][j − 1][x][y] + 1
                                if (i <= 1 && j >= 1) {
                                    ret = max(ret, Access(a, b, i + 1,j - 1,x,y) + 1);
                                }

                                if (i == 2 && j >=1) {
                                    // 1 + maxx′ ∈S(va+1){1 + F [a + 1][b][1][j − 1][x′][y]}
                                    if (a + 1 < b) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b, 0, j - 1,p,y));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a + 1][b][1][j − 1][y][y]
                                    if (a + 1 == b) {
                                        ret = max(ret, Access(a+1, b, 0, j-1, y, y) + 1);
                                    }
                                }

                                if (i <= 1 && j == 0) {
                                    // 1 + maxy′∈S(vb−1){F [a][b − 1][i + 1][3][x][y′]}
                                    if (a < b - 1) {
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int q = 0; q < n_codon_bp; q++) {
                                            local_max = max(local_max, Access(a, b-1, i + 1, 2, x, q));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a][b − 1][i + 1][3][x][x]
                                    if (a == b - 1) {
                                        ret = max(ret, Access(a, b-1, i+1, 2, x, x) + 1);
                                    }
                                }

                                if (i == 2 && j == 0) {
                                    // 1 + maxx′ ∈S(va+1),y′ ∈S(vb−1){F [a + 1][b − 1][1][3][x′][y′]}
                                    if (a + 1 < b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            for (int q = 0; q < n_codon_bp; q++) {
                                                local_max = max(local_max, Access(a+1, b-1, 0,2,p,q));
                                            }
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + maxx′ ∈S(va+1){F [a + 1][b − 1][1][3][x′][x′]}
                                    if (a + 1 == b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b-1, 0,2,p,p));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1
                                    if (sigma(b,j) - 1 == sigma(a,i) + g) { //
                                        ret = max(ret, (double)1.0);
                                    }
                                }

                            }
                            // F [a][b][i + 1][j][x][y]
                            if (i <= 1) {
                                ret = max(ret, Access(a, b, i + 1,j,x,y));
                            }
                            // F [a][b][i][j − 1][x][y]
                            if (j >= 1) {
                                ret = max(ret, Access(a, b, i,j - 1,x,y));
                            }

                            if (i == 2) {
                                // maxx′ ∈S(va+1) F [a + 1][b][1][j][x′][y]
                                if (a + 1 < b) {
                                    const int n_codon_an = n_codon[protein[a+1]];
                                    for (int p = 0; p < n_codon_an; p++) {
                                        ret = max(ret, Access(a+1, b, 0, j,p,y));
                                    }
                                }
                                // F [a + 1][b][1][j][y][y]
                                if (a + 1 == b) {
                                    ret = max(ret, Access(a+1, b, 0, j, y, y));
                                }
                            }

                            if (j == 0) {
                                // maxy′ ∈S(vb−1 ) F [a][b − 1][i][3][x][y′]
                                if (a < b - 1) {
                                    const int n_codon_bp = n_codon[protein[b-1]];
                                    for (int q = 0; q < n_codon_bp; q++) {
                                        ret = max(ret, Access(a, b - 1, i, 2, x, q));
                                    }
                                }
                                // F [a][b − 1][i][3][x][x]
                                if (a == b - 1) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, x));
                                }
                            }

                            // bifurication

                            // maxa<c<b−1,y′ ∈S(vc ),x′∈S(vc+1){F [a][c][i][3][x][y′] + F [c + 1][b][1][j][x′][y]}
                            if (a < b - 2) {
                                for (int c = a + 1; c < b-1; c++) {
                                    const int n_codon_cn = n_codon[protein[c+1]];
                                    const int n_codon_c = n_codon[protein[c]];
                                    for (int p = 0; p < n_codon_cn; p++) {
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a,c, i,2,x,q) + Access(c + 1, b, 0,j,p,y));
                                        }
                                    }
                                }
                            }
                            // maxx′ ∈S(va+1){F [a][a][i][3][x][x] + F [a + 1][b][1][j][x′][y]}
                            if (a < b-1 && i <= 2) {
                                const int n_codon_an = n_codon[protein[a+1]];
                                for (int p = 0; p < n_codon_an; p++) {
                                    ret = max(ret, Access(a, a, i, 2, x, x) + Access(a + 1, b, 0, j, p, y));
                                }
                            }
                            // maxy′∈S(vb−1 ){F [a][b − 1][i][3][x][y′] + F [b][b][1][j][y][y]}
                            if (a < b - 1 && j >= 0) {
                                const int n_codon_bp = n_codon[protein[b-1]];
                                for (int q = 0; q < n_codon_bp; q++) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, q) + Access(b, b, 0, j, y, y));
                                }
                            }
                            // F [a][a][i][3][x][x] + F [b][b][1][j][y][y]
                            if (a == b - 1 && i <= 2 && j >= 0) {
                                ret = max(ret, Access(a, a, i, 2, x, x) + Access(b, b, 0, j, y, y));
                            }
                            // maxk<3,a<c<b,x′ ∈S(vc ){F [a][c][i][k][x][x′] + F [c][b][k + 1][j][x′][y]}
                            if (a < b - 1) {
                                for (int c = a+1; c < b; c++) {
                                    for (int k = 0; k < 2; k++) {
                                        const int n_codon_c = n_codon[protein[c]];
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a, c, i,k,x,q) + Access(c, b, k + 1,j,q,y));
                                        }
                                    }
                                }
                            }
                            // F [a][a][1][2][x][x] + F [a][b][3][j][x][y]
                            if (a < b && i <= 1) {
                                for (int k = i; k < 2; k++) {
                                    ret = max(ret, Access(a, a, i, k, x, x) + Access(a, b, k+1, j, x, y));
                                }
                            }
                            // F [a][b][i][1][x][y] + F [b][b][2][3][y][y]
                            if (a < b && j >= 1) {
                                for (int k = 0; k <= j - 1; k++) {
                                    ret = max(ret, Access(a, b, i, k, x, y) + Access(b, b, k+1, j, y, y));
                                }
                            }

                            if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                                codon_index[m(n,a,b,i,j)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                                codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_y[m(n, a, b,i,j,y)])) {
                                codon_index_y[m(n,a,b,i,j,y)] = make_tuple(x,y,ret);
                            }
                            Access(a, b, i, j, x, y) = ret;

                            ans = max(ans, ret);
                        }
                    }

//                    fout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",ret: " << ret << endl;
                }
            }

        }
    }


    // find rna and base pair
    string bp = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 0);
    string rna = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 1);


    fout << "corresponding base pairs: " << bp << ",length: " << bp.size() << endl;
//    fout << "corresponding base pairs (Nussinov Validation): " << nuss_bp << ",length: " << nuss_bp.size() << endl;
    fout << "corresponding rna: " << rna << ",size: " << rna.size() << endl;
//    fout << "corresponding rna2: " << rna2 << ",size: " << rna.size() << endl;
    fout << "max base pair: " << ans << endl;
//    fout << "max base pair: (Nussinov Validation): " << nuss_ans << endl;
    auto end = chrono::high_resolution_clock::now();
    long time_take = chrono::duration_cast<chrono::seconds>(end - start).count();
    fout << "Time taken by program is : " << time_take;
    fout << "sec" << endl;

    return make_tuple(Access(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)])), rna, bp); //,0,2
}